

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::SubmitRegistryNumber(DnsStats *this,uint32_t registry_id,uint32_t number)

{
  uint32_t number_local;
  uint32_t registry_id_local;
  DnsStats *this_local;
  
  SubmitRegistryNumberAndCount(this,registry_id,number,1);
  return;
}

Assistant:

void DnsStats::SubmitRegistryNumber(uint32_t registry_id, uint32_t number)
{
    SubmitRegistryNumberAndCount(registry_id, number, 1);
}